

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QStringList * __thiscall
QFileDialogPrivate::typedFiles(QStringList *__return_storage_ptr__,QFileDialogPrivate *this)

{
  Data *pDVar1;
  char cVar2;
  qsizetype qVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  QDir local_120 [8];
  QStringBuilder<const_QString_&,_const_QString_&> local_118;
  qsizetype local_108;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  QString local_d8;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QString,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_98,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  local_58.a.d.d = (Data *)local_98.d.size;
  local_58.a.d.ptr = local_98.d.ptr;
  qVar3 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x22,0,CaseSensitive);
  if (qVar3 == -1) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialog::directory((QFileDialog *)local_f8);
    QDir::absolutePath();
    local_58.a.d.size = local_d8.d.size;
    local_58.a.d.ptr = local_d8.d.ptr;
    local_58.a.d.d = local_d8.d.d;
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    local_58.b.ucs = L'/';
    QStringBuilder<QString,_QChar>::convertTo<QString>((QString *)local_b8,&local_58);
    if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QWidgetData *)local_d8.d.d != (QWidgetData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDir::~QDir((QDir *)local_f8);
    local_d8.d.d = (Data *)local_b8;
    local_d8.d.ptr = (char16_t *)&local_98;
    QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
              (&local_58.a,(QStringBuilder<const_QString_&,_QString_&> *)&local_d8);
    cVar2 = QFile::exists((QString *)&local_58);
    if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar2 == '\0') {
      qt_tildeExpansion(&local_58.a,&local_98);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_58.a);
      QList<QString>::end((QList<QString> *)&local_78);
      if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
        LOCK();
        ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
      QList<QString>::end((QList<QString> *)&local_78);
    }
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
  }
  else {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QString::split(local_b8,&local_98,0x22,0,1);
    if (local_a8 != (undefined1 *)0x0) {
      lVar5 = 0x10;
      puVar6 = (undefined1 *)0x0;
      puVar4 = local_a8;
      do {
        if (((ulong)puVar6 & 1) != 0) {
          local_d8.d.d = *(Data **)(local_b8._8_8_ + lVar5 + -0x10);
          local_d8.d.ptr = *(char16_t **)(local_b8._8_8_ + lVar5 + -8);
          local_d8.d.size = *(qsizetype *)((long)&((DataPointer *)local_b8._8_8_)->d + lVar5);
          if ((QWidgetData *)local_d8.d.d != (QWidgetData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((QWidgetData *)local_d8.d.d)->winid)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((QWidgetData *)local_d8.d.d)->winid)->_q_value).
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QFileDialog::directory((QFileDialog *)local_120);
          QDir::absolutePath();
          local_58.a.d.size = local_108;
          local_58.a.d.ptr = (char16_t *)local_118.b;
          local_58.a.d.d = (Data *)local_118.a;
          local_118.a = (QString *)0x0;
          local_118.b = (QString *)0x0;
          local_108 = 0;
          local_58.b.ucs = L'/';
          QStringBuilder<QString,_QChar>::convertTo<QString>((QString *)local_f8,&local_58);
          pDVar1 = local_58.a.d.d;
          if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
            LOCK();
            ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)local_118.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_118.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_118.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_118.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_118.a,2,0x10);
            }
          }
          QDir::~QDir(local_120);
          local_118.a = (QString *)local_f8;
          local_118.b = &local_d8;
          QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                    (&local_58.a,&local_118);
          cVar2 = QFile::exists((QString *)&local_58);
          pDVar1 = local_58.a.d.d;
          if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
            LOCK();
            ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (cVar2 == '\0') {
            qt_tildeExpansion(&local_58.a,&local_d8);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_58.a);
            QList<QString>::end((QList<QString> *)&local_78);
            pDVar1 = local_58.a.d.d;
            if ((QWidgetData *)local_58.a.d.d != (QWidgetData *)0x0) {
              LOCK();
              ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_d8);
            QList<QString>::end((QList<QString> *)&local_78);
          }
          if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
            }
          }
          puVar4 = local_a8;
          if ((QWidgetData *)local_d8.d.d != (QWidgetData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
              puVar4 = local_a8;
            }
          }
        }
        puVar6 = puVar6 + 1;
        lVar5 = lVar5 + 0x18;
      } while (puVar6 < puVar4);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_b8);
  }
  addDefaultSuffixToFiles(__return_storage_ptr__,this,(QStringList *)&local_78);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileDialogPrivate::typedFiles() const
{
    Q_Q(const QFileDialog);
    QStringList files;
    QString editText = lineEdit()->text();
    if (!editText.contains(u'"')) {
#ifdef Q_OS_UNIX
        const QString prefix = q->directory().absolutePath() + QDir::separator();
        if (QFile::exists(prefix + editText))
            files << editText;
        else
            files << qt_tildeExpansion(editText);
#else
        files << editText;
        Q_UNUSED(q);
#endif
    } else {
        // " is used to separate files like so: "file1" "file2" "file3" ...
        // ### need escape character for filenames with quotes (")
        QStringList tokens = editText.split(u'\"');
        for (int i=0; i<tokens.size(); ++i) {
            if ((i % 2) == 0)
                continue; // Every even token is a separator
#ifdef Q_OS_UNIX
            const QString token = tokens.at(i);
            const QString prefix = q->directory().absolutePath() + QDir::separator();
            if (QFile::exists(prefix + token))
                files << token;
            else
                files << qt_tildeExpansion(token);
#else
            files << toInternal(tokens.at(i));
#endif
        }
    }
    return addDefaultSuffixToFiles(files);
}